

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryCoding.h
# Opt level: O0

void __thiscall
llbuild::basic::BinaryEncoder::write<llbuild::basic::FileTimestamp>
          (BinaryEncoder *this,FileTimestamp *value)

{
  FileTimestamp *value_local;
  BinaryEncoder *this_local;
  
  BinaryCodingTraits<llbuild::basic::FileTimestamp>::encode(value,this);
  return;
}

Assistant:

void write(const T& value) {
    BinaryCodingTraits<T>::encode(value, *this);
  }